

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O1

void Dtc_ManComputeCuts(Gia_Man_t *p,Vec_Int_t **pvCutsXor,Vec_Int_t **pvCutsMaj,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *vCuts;
  int *piVar5;
  Vec_Int_t *vCutsXor;
  Vec_Int_t *vCutsMaj;
  Vec_Int_t *pVVar6;
  Vec_Int_t *pVVar7;
  long lVar8;
  Gia_Obj_t *pGVar9;
  uint uVar10;
  char *__function;
  int iVar11;
  uint uVar12;
  char *__file;
  char *__assertion;
  int iVar13;
  long lVar14;
  double dVar15;
  
  vCuts = (Vec_Int_t *)malloc(0x10);
  vCuts->nCap = 1000;
  vCuts->nSize = 0;
  piVar5 = (int *)malloc(4000);
  vCuts->pArray = piVar5;
  uVar10 = p->nObjs;
  pVVar6 = p->vCis;
  pVVar7 = p->vCos;
  uVar12 = ~(pVVar7->nSize + pVVar6->nSize);
  vCutsXor = (Vec_Int_t *)malloc(0x10);
  iVar13 = uVar10 + uVar12;
  if ((uVar10 + uVar12) - 1 < 0xf) {
    iVar13 = 0x10;
  }
  vCutsXor->nSize = 0;
  vCutsXor->nCap = iVar13;
  if (iVar13 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar13 << 2);
  }
  vCutsXor->pArray = piVar5;
  uVar12 = ~(pVVar7->nSize + pVVar6->nSize);
  vCutsMaj = (Vec_Int_t *)malloc(0x10);
  iVar13 = uVar10 + uVar12;
  if ((uVar10 + uVar12) - 1 < 0xf) {
    iVar13 = 0x10;
  }
  vCutsMaj->nSize = 0;
  vCutsMaj->nCap = iVar13;
  if (iVar13 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar13 << 2);
  }
  vCutsMaj->pArray = piVar5;
  iVar13 = (~(pVVar7->nSize + pVVar6->nSize) + uVar10) * 0x1e;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < iVar13 - 1U) {
    iVar11 = iVar13;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar11;
  if (iVar11 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar11 << 2);
  }
  pVVar6->pArray = piVar5;
  if (iVar11 < (int)uVar10) {
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar10 << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)(int)uVar10 << 2);
    }
    pVVar6->pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar6->nCap = uVar10;
  }
  if (0 < (int)uVar10) {
    memset(pVVar6->pArray,0,(ulong)uVar10 * 4);
  }
  pVVar6->nSize = uVar10;
  Gia_ManCleanValue(p);
  pVVar7 = p->vCis;
  if (0 < pVVar7->nSize) {
    lVar14 = 0;
    do {
      iVar13 = pVVar7->pArray[lVar14];
      lVar8 = (long)iVar13;
      if ((lVar8 < 0) || (p->nObjs <= iVar13)) {
        __assertion = "v >= 0 && v < p->nObjs";
        __file = 
        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
        ;
        __function = "Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)";
        goto LAB_005d9380;
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (pVVar6->nSize <= iVar13) goto LAB_005d934c;
      pGVar9 = p->pObjs + lVar8;
      pVVar6->pArray[lVar8] = pVVar6->nSize;
      Vec_IntPush(pVVar6,1);
      Vec_IntPush(pVVar6,1);
      pGVar4 = p->pObjs;
      if ((pGVar9 < pGVar4) || (pGVar4 + p->nObjs <= pGVar9)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(pVVar6,(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555);
      lVar14 = lVar14 + 1;
      pVVar7 = p->vCis;
    } while (lVar14 < pVVar7->nSize);
  }
  iVar13 = p->nObjs;
  iVar11 = 0;
  if ((0 < iVar13) && (pGVar9 = p->pObjs, pGVar9 != (Gia_Obj_t *)0x0)) {
    iVar11 = 0;
    lVar14 = 0;
    do {
      uVar10 = (uint)*(undefined8 *)(pGVar9 + lVar14);
      if ((~uVar10 & 0x1fffffff) != 0 && -1 < (int)uVar10) {
        iVar13 = (int)lVar14;
        uVar10 = iVar13 - (uVar10 & 0x1fffffff);
        if (((int)uVar10 < 0) || (iVar1 = pVVar6->nSize, iVar1 <= (int)uVar10)) goto LAB_005d932d;
        piVar5 = pVVar6->pArray;
        iVar2 = piVar5[uVar10];
        if (((long)iVar2 < 0) || (iVar1 <= iVar2)) {
LAB_005d936b:
          __assertion = "i >= 0 && i < p->nSize";
          __file = 
          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
          ;
          __function = "int *Vec_IntEntryP(Vec_Int_t *, int)";
LAB_005d9380:
          __assert_fail(__assertion,__file,0x1af,__function);
        }
        uVar10 = iVar13 - ((uint)((ulong)*(undefined8 *)(pGVar9 + lVar14) >> 0x20) & 0x1fffffff);
        if (((int)uVar10 < 0) || (iVar1 <= (int)uVar10)) goto LAB_005d932d;
        iVar3 = piVar5[uVar10];
        if (((long)iVar3 < 0) || (iVar1 <= iVar3)) goto LAB_005d936b;
        Dtc_ManCutMerge(p,iVar13,piVar5 + iVar2,piVar5 + iVar3,vCuts,vCutsXor,vCutsMaj);
        if (iVar1 <= lVar14) {
LAB_005d934c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar5[lVar14] = iVar1;
        iVar13 = vCuts->nSize;
        if ((long)iVar13 < 1) {
LAB_005d932d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar5 = vCuts->pArray;
        lVar8 = 0;
        do {
          Vec_IntPush(pVVar6,piVar5[lVar8]);
          lVar8 = lVar8 + 1;
        } while (iVar13 != lVar8);
        if (iVar13 < 1) goto LAB_005d932d;
        iVar11 = iVar11 + *vCuts->pArray;
      }
      lVar14 = lVar14 + 1;
      iVar13 = p->nObjs;
    } while ((lVar14 < iVar13) && (pGVar9 = p->pObjs, pGVar9 != (Gia_Obj_t *)0x0));
  }
  if (fVerbose != 0) {
    dVar15 = (double)(iVar13 + ~(p->vCos->nSize + p->vCis->nSize));
    printf("Nodes = %d.  Cuts = %d.  Cuts/Node = %.2f.  Ints/Node = %.2f.\n",(double)iVar11 / dVar15
           ,(double)pVVar6->nSize / dVar15);
  }
  if (vCuts->pArray != (int *)0x0) {
    free(vCuts->pArray);
    vCuts->pArray = (int *)0x0;
  }
  free(vCuts);
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (int *)0x0;
  }
  free(pVVar6);
  *pvCutsXor = vCutsXor;
  *pvCutsMaj = vCutsMaj;
  return;
}

Assistant:

void Dtc_ManComputeCuts( Gia_Man_t * p, Vec_Int_t ** pvCutsXor, Vec_Int_t ** pvCutsMaj, int fVerbose )
{
    Gia_Obj_t * pObj; 
    int * pList0, * pList1, i, nCuts = 0;
    Vec_Int_t * vTemp = Vec_IntAlloc( 1000 );
    Vec_Int_t * vCutsXor = Vec_IntAlloc( Gia_ManAndNum(p) );
    Vec_Int_t * vCutsMaj = Vec_IntAlloc( Gia_ManAndNum(p) );
    Vec_Int_t * vCuts = Vec_IntAlloc( 30 * Gia_ManAndNum(p) );
    Vec_IntFill( vCuts, Gia_ManObjNum(p), 0 );
    Gia_ManCleanValue( p );
    Gia_ManForEachCi( p, pObj, i )
    {
        Vec_IntWriteEntry( vCuts, Gia_ObjId(p, pObj), Vec_IntSize(vCuts) );
        Vec_IntPush( vCuts, 1 );
        Vec_IntPush( vCuts, 1 );
        Vec_IntPush( vCuts, Gia_ObjId(p, pObj) );
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        pList0 = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, Gia_ObjFaninId0(pObj, i)) );
        pList1 = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, Gia_ObjFaninId1(pObj, i)) );
        Dtc_ManCutMerge( p, i, pList0, pList1, vTemp, vCutsXor, vCutsMaj );
        Vec_IntWriteEntry( vCuts, i, Vec_IntSize(vCuts) );
        Vec_IntAppend( vCuts, vTemp );
        nCuts += Vec_IntEntry( vTemp, 0 );
    }
    if ( fVerbose )
        printf( "Nodes = %d.  Cuts = %d.  Cuts/Node = %.2f.  Ints/Node = %.2f.\n", 
            Gia_ManAndNum(p), nCuts, 1.0*nCuts/Gia_ManAndNum(p), 1.0*Vec_IntSize(vCuts)/Gia_ManAndNum(p) );
    Vec_IntFree( vTemp );
    Vec_IntFree( vCuts );
    *pvCutsXor = vCutsXor;
    *pvCutsMaj = vCutsMaj;
}